

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O3

void __thiscall dxil_spv::SPIRVModule::Impl::Impl(Impl *this,SPIRVModule *module)

{
  (this->super_BlockEmissionInterface)._vptr_BlockEmissionInterface =
       (_func_int **)&PTR__Impl_001f3c70;
  this->self = module;
  (this->build_logger).tbdFeatures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->build_logger).tbdFeatures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->build_logger).tbdFeatures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->build_logger).missingFeatures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->build_logger).missingFeatures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->build_logger).missingFeatures.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->build_logger).warnings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->build_logger).warnings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->build_logger).warnings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->build_logger).errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->build_logger).errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->build_logger).errors.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>,_dxil_spv::ThreadLocalAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  spv::Builder::Builder(&this->builder,0x7541521e,&this->build_logger);
  this->discard_function_cond = (Function *)0x0;
  this->demote_function_cond = (Function *)0x0;
  this->entry_point = (Instruction *)0x0;
  this->discard_function = (Function *)0x0;
  this->entry_function = (Function *)0x0;
  this->active_function = (Function *)0x0;
  this->discard_state_var_id = 0;
  this->execution_model = ExecutionModelMax;
  (this->caps).supports_demote = false;
  (this->builtins_input)._M_h._M_buckets = &(this->builtins_input)._M_h._M_single_bucket;
  (this->builtins_input)._M_h._M_bucket_count = 1;
  (this->builtins_input)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->builtins_input)._M_h._M_element_count = 0;
  (this->builtins_input)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->builtins_input)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->builtins_input)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->id_to_builtin_input)._M_h._M_buckets = &(this->id_to_builtin_input)._M_h._M_single_bucket;
  (this->id_to_builtin_input)._M_h._M_bucket_count = 1;
  (this->id_to_builtin_input)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id_to_builtin_input)._M_h._M_element_count = 0;
  (this->id_to_builtin_input)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->id_to_builtin_input)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id_to_builtin_input)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->builtins_output)._M_h._M_buckets = &(this->builtins_output)._M_h._M_single_bucket;
  (this->builtins_output)._M_h._M_bucket_count = 1;
  (this->builtins_output)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->builtins_output)._M_h._M_element_count = 0;
  (this->builtins_output)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->builtins_output)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->builtins_output)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->id_to_builtin_output)._M_h._M_buckets = &(this->id_to_builtin_output)._M_h._M_single_bucket
  ;
  (this->id_to_builtin_output)._M_h._M_bucket_count = 1;
  (this->id_to_builtin_output)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->id_to_builtin_output)._M_h._M_element_count = 0;
  (this->id_to_builtin_output)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->operation_pool).current.size = 0;
  (this->operation_pool).current.base = (Operation *)0x0;
  (this->operation_pool).current.offset = 0;
  (this->id_to_builtin_output)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->id_to_builtin_output)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->operation_pool).next_allocate_size = 0x40;
  (this->descriptor_qa_info).shader_hash = 0;
  this->override_spirv_version = 0;
  (this->operation_pool).blocks.
  super__Vector_base<std::unique_ptr<dxil_spv::Operation,_dxil_spv::ScratchPool<dxil_spv::Operation>::MallocDeleter>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::Operation,_dxil_spv::ScratchPool<dxil_spv::Operation>::MallocDeleter>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->operation_pool).blocks.
  super__Vector_base<std::unique_ptr<dxil_spv::Operation,_dxil_spv::ScratchPool<dxil_spv::Operation>::MallocDeleter>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::Operation,_dxil_spv::ScratchPool<dxil_spv::Operation>::MallocDeleter>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->operation_pool).blocks.
           super__Vector_base<std::unique_ptr<dxil_spv::Operation,_dxil_spv::ScratchPool<dxil_spv::Operation>::MallocDeleter>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::Operation,_dxil_spv::ScratchPool<dxil_spv::Operation>::MallocDeleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->operation_pool).blocks.
           super__Vector_base<std::unique_ptr<dxil_spv::Operation,_dxil_spv::ScratchPool<dxil_spv::Operation>::MallocDeleter>,_dxil_spv::ThreadLocalAllocator<std::unique_ptr<dxil_spv::Operation,_dxil_spv::ScratchPool<dxil_spv::Operation>::MallocDeleter>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  this->quad_any_call_id = 0;
  this->wave_is_first_lane_masked_id = 0;
  this->descriptor_qa_helper_call_id = 0;
  this->wave_multi_prefix_count_bits_id = 0;
  this->robust_atomic_counter_call_id = 0;
  this->quad_all_call_id = 0;
  memset(&this->wave_match_call_ids,0,0xdc);
  this->helper_lanes_participate_in_wave_ops = true;
  (this->instruction_instrumentation).instruction_count = 0;
  (this->instruction_instrumentation).nan_inf_instrument_fp16_call_id = 0;
  (this->instruction_instrumentation).nan_inf_instrument_fp32_call_id = 0;
  (this->instruction_instrumentation).nan_inf_instrument_fp64_call_id = 0;
  (this->instruction_instrumentation).assume_true_call_id = 0;
  (this->instruction_instrumentation).should_report_instrumentation_id = 0;
  (this->instruction_instrumentation).global_nan_inf_control_var_id = 0;
  (this->instruction_instrumentation).global_nan_inf_data_var_id = 0;
  (this->instruction_instrumentation).info.version = 0;
  (this->instruction_instrumentation).info.enabled = false;
  (this->instruction_instrumentation).info.fp16 = false;
  (this->instruction_instrumentation).info.fp32 = false;
  (this->instruction_instrumentation).info.fp64 = false;
  (this->instruction_instrumentation).info.control_desc_set = 0;
  (this->instruction_instrumentation).info.control_binding = 0;
  (this->instruction_instrumentation).info.payload_desc_set = 0;
  (this->instruction_instrumentation).info.payload_binding = 0;
  (this->instruction_instrumentation).info.shader_hash = 0;
  (this->instruction_instrumentation).info.type = FullNanInf;
  return;
}

Assistant:

explicit Impl(SPIRVModule &module)
	    : self(module), builder(GENERATOR, &build_logger)
	{
	}